

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_utils.c
# Opt level: O2

int qc_blockque_put(QcBlockQue *queue,void *ptr)

{
  uint cell;
  int iVar1;
  char *str;
  
  qc_thread_condlock_lock(queue->cond_lock);
  cell = qc_staticlist_get_head(&queue->lst_free);
  if (cell == 0xffffff9d) {
    iVar1 = -100;
  }
  else {
    if ((int)cell < 0) {
      str = "error happend when get from QcBlockQue->qc_staticlist_free.";
      iVar1 = 0x1f9;
    }
    else {
      queue->ptr_array[cell] = ptr;
      iVar1 = qc_staticlist_add_tail(&queue->lst_used,cell);
      if (-1 < iVar1) {
        qc_thread_condition_signal(queue->cond);
        iVar1 = 0;
        goto LAB_00104f0c;
      }
      str = "error happend when add tail to QcBlockQue->qc_staticlist_used.";
      iVar1 = 0x203;
    }
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_utils.c"
              ,iVar1,str);
    iVar1 = -1;
  }
LAB_00104f0c:
  qc_thread_condlock_unlock(queue->cond_lock);
  return iVar1;
}

Assistant:

int qc_blockque_put(QcBlockQue *queue, void *ptr)
{
	int index;

	qc_thread_condlock_lock(queue->cond_lock);

	index = qc_staticlist_get_head(&queue->lst_free);
	if (QC_INVALID_INT == index)
	{
		qc_thread_condlock_unlock(queue->cond_lock);
		return QC_FULLED;
	}
	else if (index < 0)
	{
		qc_error("error happend when get from QcBlockQue->qc_staticlist_free.");
		qc_thread_condlock_unlock(queue->cond_lock);
		return -1;
	}

	queue->ptr_array[index] = ptr;

	index = qc_staticlist_add_tail(&queue->lst_used, index);
	if (index < 0)
	{
		qc_error("error happend when add tail to QcBlockQue->qc_staticlist_used.");
		qc_thread_condlock_unlock(queue->cond_lock);
		return -1;
	}

	qc_thread_condition_signal(queue->cond);
	qc_thread_condlock_unlock(queue->cond_lock);

	return 0;
}